

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

AffineSpace3ff * __thiscall
embree::XMLLoader::loadQuaternion
          (AffineSpace3ff *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XML *pXVar2;
  Token *this_00;
  int iVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 local_1f8 [16];
  char local_1e8 [16];
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [28];
  float local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pXVar2 = xml->ptr;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"translate","");
  XML::parm(&local_1d8,pXVar2,(string *)local_1f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((char *)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (iVar3 == 0) {
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_188._0_16_ = ZEXT816(0);
  }
  else {
    pXVar2 = xml->ptr;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"translate","");
    XML::parm(&local_50,pXVar2,&local_1d8);
    string_to_Vec3f((embree *)local_1f8,&local_50);
    local_188._0_16_ = ZEXT416((uint)local_1f8._0_4_);
    local_1b8 = CONCAT44(local_1f8._8_4_,local_1f8._4_4_);
    uStack_1b0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  pXVar2 = xml->ptr;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"scale","");
  XML::parm(&local_1d8,pXVar2,(string *)local_1f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((char *)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (iVar3 == 0) {
    local_168 = 0x3f8000003f800000;
    uStack_160 = 0;
    local_198 = ZEXT816(0x3f800000);
  }
  else {
    pXVar2 = xml->ptr;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"scale","");
    XML::parm(&local_70,pXVar2,&local_1d8);
    string_to_Vec3f((embree *)local_1f8,&local_70);
    local_198 = ZEXT416((uint)local_1f8._0_4_);
    local_168 = CONCAT44(local_1f8._8_4_,local_1f8._4_4_);
    uStack_160 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  pXVar2 = xml->ptr;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"skew","");
  XML::parm(&local_1d8,pXVar2,(string *)local_1f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((char *)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (iVar3 == 0) {
    local_158 = 0;
    uStack_150 = 0;
    local_118 = ZEXT816(0);
  }
  else {
    pXVar2 = xml->ptr;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"skew","");
    XML::parm(&local_90,pXVar2,&local_1d8);
    string_to_Vec3f((embree *)local_1f8,&local_90);
    local_118 = ZEXT416((uint)local_1f8._0_4_);
    local_158 = CONCAT44(local_1f8._8_4_,local_1f8._4_4_);
    uStack_150 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  pXVar2 = xml->ptr;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"shift","");
  XML::parm(&local_1d8,pXVar2,(string *)local_1f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((char *)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (iVar3 == 0) {
    local_138 = (char *)0x0;
    uStack_130 = 0;
    local_128 = ZEXT816(0);
  }
  else {
    pXVar2 = xml->ptr;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"shift","");
    XML::parm(&local_b0,pXVar2,&local_1d8);
    string_to_Vec3f((embree *)local_1f8,&local_b0);
    local_138 = (char *)local_1f8._0_8_;
    uStack_130 = 0;
    local_128 = ZEXT416((uint)local_1f8._8_4_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  pXVar2 = xml->ptr;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"rotate","");
  XML::parm(&local_1d8,pXVar2,(string *)local_1f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((char *)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (iVar3 == 0) {
    _local_1a8 = ZEXT812(0);
    uStack_1a0._4_4_ = 1.0;
  }
  else {
    pXVar2 = xml->ptr;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"rotate","");
    XML::parm(&local_d0,pXVar2,&local_1d8);
    string_to_Vec4f((embree *)local_1f8,&local_d0);
    _local_1a8 = ZEXT416((uint)local_1f8._0_4_);
    local_108 = CONCAT44(local_1f8._8_4_,local_1f8._4_4_);
    uStack_100 = 0;
    local_148 = (float)local_1f8._12_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_16c = local_148 * 0.017453292 * 0.5;
    local_148 = cosf(local_16c);
    fVar4 = sinf(local_16c);
    fVar5 = (float)local_1a8._0_4_ * (float)local_1a8._0_4_ +
            (float)local_108 * (float)local_108 + local_108._4_4_ * local_108._4_4_;
    auVar7._4_4_ = local_1a8._4_4_;
    auVar7._0_4_ = fVar5;
    auVar7._8_4_ = (float)uStack_1a0;
    auVar7._12_4_ = uStack_1a0._4_4_;
    auVar8._4_4_ = local_1a8._4_4_;
    auVar8._0_4_ = fVar5;
    auVar8._8_4_ = (float)uStack_1a0;
    auVar8._12_4_ = uStack_1a0._4_4_;
    auVar8 = rsqrtss(auVar7,auVar8);
    fVar6 = auVar8._0_4_;
    fVar5 = fVar6 * 1.5 - fVar6 * fVar6 * fVar5 * 0.5 * fVar6;
    local_1a8._4_4_ = fVar4 * fVar5 * (float)local_108;
    local_1a8._0_4_ = (float)local_1a8._0_4_ * fVar5 * fVar4;
    uStack_1a0._0_4_ = fVar4 * fVar5 * local_108._4_4_;
    uStack_1a0._4_4_ = local_148;
  }
  pXVar2 = xml->ptr;
  local_1f8._0_8_ = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"quaternion","");
  XML::parm(&local_1d8,pXVar2,(string *)local_1f8);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((char *)local_1f8._0_8_ != local_1e8) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (iVar3 != 0) {
    pXVar2 = xml->ptr;
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"quaternion","");
    XML::parm(&local_f0,pXVar2,&local_1d8);
    string_to_Vec4f((embree *)local_1f8,&local_f0);
    uStack_1a0._4_4_ = (float)local_1f8._12_4_;
    uStack_1a0._0_4_ = (float)local_1f8._8_4_;
    local_1a8 = (undefined1  [8])local_1f8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  (__return_storage_ptr__->l).vx.field_0.m128[0] = (float)local_198._0_4_;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = (float)local_138;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = local_138._4_4_;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = (float)local_1a8._0_4_;
  (__return_storage_ptr__->l).vy.field_0.m128[0] = (float)local_118._0_4_;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = (float)local_168;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = (float)local_128._0_4_;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = (float)local_1a8._4_4_;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = (float)local_158;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = local_158._4_4_;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = local_168._4_4_;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = (float)uStack_1a0;
  (__return_storage_ptr__->p).field_0.m128[0] = (float)local_188._0_4_;
  (__return_storage_ptr__->p).field_0.m128[1] = (float)local_1b8;
  (__return_storage_ptr__->p).field_0.m128[2] = local_1b8._4_4_;
  (__return_storage_ptr__->p).field_0.m128[3] = uStack_1a0._4_4_;
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x480) {
    local_1a8._0_4_ = Token::Float(this_00,true);
    local_1a8._4_4_ = extraout_XMM0_Db;
    uStack_1a0._0_4_ = (float)extraout_XMM0_Dc;
    uStack_1a0._4_4_ = (float)extraout_XMM0_Dd;
    local_188._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 4,true);
    local_188._4_4_ = extraout_XMM0_Db_00;
    local_188._8_4_ = extraout_XMM0_Dc_00;
    local_188._12_4_ = extraout_XMM0_Dd_00;
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 8,true);
    local_1b8 = CONCAT44(extraout_XMM0_Db_01,fVar4);
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xc,true);
    local_1a8._4_4_ = local_188._0_4_;
    uStack_1a0._0_4_ = (float)local_1b8;
    uStack_1a0._4_4_ = fVar4;
    local_188._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 1,true);
    local_188._4_4_ = extraout_XMM0_Db_02;
    local_188._8_4_ = extraout_XMM0_Dc_01;
    local_188._12_4_ = extraout_XMM0_Dd_01;
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 5,true);
    local_1b8 = CONCAT44(extraout_XMM0_Db_03,fVar4);
    local_198._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 9,true);
    local_198._4_4_ = extraout_XMM0_Db_04;
    local_198._8_4_ = extraout_XMM0_Dc_02;
    local_198._12_4_ = extraout_XMM0_Dd_02;
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xd,true);
    local_188._4_4_ = (float)local_1b8;
    local_188._8_4_ = local_198._0_4_;
    local_188._12_4_ = fVar4;
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 2,true);
    local_1b8 = CONCAT44(extraout_XMM0_Db_05,fVar4);
    local_198._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 6,true);
    local_198._4_4_ = extraout_XMM0_Db_06;
    local_198._8_4_ = extraout_XMM0_Dc_03;
    local_198._12_4_ = extraout_XMM0_Dd_03;
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 10,true);
    local_168 = CONCAT44(extraout_XMM0_Db_07,fVar4);
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xe,true);
    local_1b8 = CONCAT44(local_198._0_4_,(int)local_1b8);
    uStack_1b0 = CONCAT44(fVar4,(int)local_168);
    local_198._0_4_ =
         Token::Float((xml->ptr->body).
                      super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                      super__Vector_impl_data._M_start + 3,true);
    local_198._4_4_ = extraout_XMM0_Db_08;
    local_198._8_4_ = extraout_XMM0_Dc_04;
    local_198._12_4_ = extraout_XMM0_Dd_04;
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 7,true);
    local_168 = CONCAT44(extraout_XMM0_Db_09,fVar4);
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xb,true);
    local_158 = CONCAT44(extraout_XMM0_Db_10,fVar4);
    fVar4 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 0xf,true);
    *(undefined1 (*) [8])&(__return_storage_ptr__->l).vx.field_0 = local_1a8;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uStack_1a0;
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = local_188._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = local_1b8;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_1b0;
    (__return_storage_ptr__->p).field_0.m128[0] = (float)local_198._0_4_;
    (__return_storage_ptr__->p).field_0.m128[1] = (float)local_168;
    (__return_storage_ptr__->p).field_0.m128[2] = (float)local_158;
    (__return_storage_ptr__->p).field_0.m128[3] = fVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3ff XMLLoader::loadQuaternion(const Ref<XML>& xml)
  {
    Vec3f scale(1.f, 1.f, 1.f);
    Vec3f shift(0.f, 0.f, 0.f);
    Vec3f skew(0.f, 0.f, 0.f);
    Vec3f translate(0.f, 0.f, 0.f);
    Vec4f q(0.f, 0.f, 0.f, 1.f);

    if (xml->parm("translate") != "")
      translate = string_to_Vec3f(xml->parm("translate"));
    if (xml->parm("scale") != "")
      scale = string_to_Vec3f(xml->parm("scale"));
    if (xml->parm("skew") != "")
      skew = string_to_Vec3f(xml->parm("skew"));
    if (xml->parm("shift") != "")
      shift = string_to_Vec3f(xml->parm("shift"));
    if (xml->parm("rotate") != "") {
      q = string_to_Vec4f(xml->parm("rotate"));
      // convert from degree to radians
      q.w = 2.f*M_PI/360.f*q.w;
      Quaternion3f Q = Quaternion3f::rotate(Vec3fa(q.x, q.y, q.z), q.w);
      q = Vec4f(Q.i, Q.j, Q.k, Q.r);
    }
    if (xml->parm("quaternion") != "") {
      q = string_to_Vec4f(xml->parm("quaternion"));
    }

    AffineSpace3ff res(LinearSpace3fa(
      Vec3ff(scale.x, shift.x, shift.y, q.x),
      Vec3ff(skew.x, scale.y, shift.z, q.y),
      Vec3ff(skew.y, skew.z, scale.z, q.z)),
      Vec3ff(translate.x, translate.y, translate.z, q.w));

    if (xml->body.size() == 16) {
      res = AffineSpace3ff(LinearSpace3fa(Vec3ff(xml->body[ 0].Float(),xml->body[ 4].Float(),xml->body[ 8].Float(),xml->body[12].Float()),
                                          Vec3ff(xml->body[ 1].Float(),xml->body[ 5].Float(),xml->body[ 9].Float(),xml->body[13].Float()),
                                          Vec3ff(xml->body[ 2].Float(),xml->body[ 6].Float(),xml->body[10].Float(),xml->body[14].Float())),
                                          Vec3ff(xml->body[ 3].Float(),xml->body[ 7].Float(),xml->body[11].Float(),xml->body[15].Float()));
    }
    return res;
  }